

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<choc::value::Type,_2UL>::clear
          (ArrayWithPreallocation<choc::value::Type,_2UL> *this)

{
  char cVar1;
  Type *pTVar2;
  long lVar3;
  ulong uVar4;
  Object *this_00;
  long *plVar5;
  
  if (this->numActive != 0) {
    lVar3 = 0x18;
    uVar4 = 0;
    do {
      pTVar2 = this->items;
      cVar1 = *(char *)((long)pTVar2 + lVar3 + -0x18);
      if (cVar1 < '\0') {
        if (cVar1 == -0x70) {
          this_00 = *(Object **)((long)pTVar2 + lVar3 + -0x10);
          if (this_00 != (Object *)0x0) {
            plVar5 = *(long **)(&pTVar2->mainType + lVar3);
            choc::value::Type::Object::~Object(this_00);
            goto LAB_0027306c;
          }
        }
        else if ((cVar1 == -0x80) &&
                (this_00 = *(Object **)((long)pTVar2 + lVar3 + -0x10), this_00 != (Object *)0x0)) {
          plVar5 = *(long **)(&pTVar2->mainType + lVar3);
          choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
          ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                           this_00);
LAB_0027306c:
          if (plVar5 == (long *)0x0) {
            free(this_00);
          }
          else {
            (**(code **)(*plVar5 + 0x20))(plVar5,this_00);
          }
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < this->numActive);
  }
  this->numActive = 0;
  if (2 < this->numAllocated) {
    if (this->items != (Type *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (Type *)this->space;
    this->numAllocated = 2;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }